

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepulsivePower.cpp
# Opt level: O0

void __thiscall OpenMD::RepulsivePower::initialize(RepulsivePower *this)

{
  value_type vVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  AtomType *this_00;
  reference pvVar6;
  size_type sVar7;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  int nRep;
  RealType epsilon;
  RealType sigma;
  RepulsivePowerInteractionType *rpit;
  int atid2;
  int atid1;
  AtomType *at2;
  AtomType *at1;
  int rptid2;
  int rptid1;
  NonBondedInteractionType *nbt;
  KeyType keys;
  MapTypeIterator j;
  NonBondedInteractionTypeContainer *nbiTypes;
  AtomType *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *in_stack_fffffffffffffdb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  errorStruct *in_stack_fffffffffffffdd0;
  size_type in_stack_fffffffffffffdd8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffde0;
  AtomType *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  value_type in_stack_fffffffffffffdf4;
  undefined8 in_stack_fffffffffffffe48;
  RealType in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  errorStruct *in_stack_fffffffffffffe60;
  AtomType *atype1;
  string local_f8 [32];
  string local_d8 [32];
  RepulsivePowerInteractionType *local_b8;
  _Base_ptr local_b0;
  undefined1 local_a8;
  int local_9c;
  _Base_ptr local_98;
  undefined1 local_90;
  int local_84;
  AtomType *local_80;
  AtomType *local_78;
  value_type local_48;
  value_type local_44;
  AtomType *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::NonBondedInteractionType_*>_>_>
  local_20;
  NonBondedInteractionTypeContainer *local_18;
  undefined4 local_c;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2fd378);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x2fd391);
  std::
  vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
  ::clear((vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
           *)0x2fd3a2);
  ForceField::getNAtomType((ForceField *)0x2fd3b3);
  local_c = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             (value_type_conflict2 *)in_stack_fffffffffffffdd0);
  local_18 = ForceField::getNonBondedInteractionTypes(*(ForceField **)(in_RDI + 0x70));
  std::
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::NonBondedInteractionType_*>_>_>
  ::_Rb_tree_iterator(&local_20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2fd411);
  local_40 = (AtomType *)
             TypeContainer<OpenMD::NonBondedInteractionType,_2>::beginType
                       ((TypeContainer<OpenMD::NonBondedInteractionType,_2> *)
                        in_stack_fffffffffffffdd0,(MapTypeIterator *)in_stack_fffffffffffffdc8);
  while (local_40 != (AtomType *)0x0) {
    bVar2 = NonBondedInteractionType::isRepulsivePower((NonBondedInteractionType *)local_40);
    if (bVar2) {
      TypeContainer<OpenMD::NonBondedInteractionType,_2>::getKeys
                (in_stack_fffffffffffffdb8,
                 (MapTypeIterator *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffffdc0,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffdb8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffdc0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_38,0);
      local_78 = ForceField::getAtomType
                           ((ForceField *)
                            CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                            (string *)in_stack_fffffffffffffde8);
      if (local_78 == (AtomType *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,0);
        uVar3 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,0);
        uVar4 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,1);
        uVar5 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "RepulsivePower::initialize could not find AtomType %s\n\tto for for %s - %s interaction.\n"
                 ,uVar3,uVar4,uVar5);
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      atype1 = *(AtomType **)(in_RDI + 0x70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_38,1);
      this_00 = ForceField::getAtomType
                          ((ForceField *)
                           CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                           (string *)in_stack_fffffffffffffde8);
      local_80 = this_00;
      if (this_00 == (AtomType *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,1);
        in_stack_fffffffffffffe48 = std::__cxx11::string::c_str();
        in_stack_fffffffffffffe5c = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,0);
        in_stack_fffffffffffffe50 = (RealType)std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,1);
        uVar3 = std::__cxx11::string::c_str();
        in_stack_fffffffffffffe60 = &painCave;
        snprintf(painCave.errMsg,2000,
                 "RepulsivePower::initialize could not find AtomType %s\n\tfor %s - %s nonbonded interaction.\n"
                 ,in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,uVar3);
        in_stack_fffffffffffffe60->severity = 1;
        in_stack_fffffffffffffe60->isFatal = 1;
        simError();
      }
      local_84 = AtomType::getIdent(local_78);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_84);
      if (*pvVar6 == -1) {
        sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2fd7a4);
        local_44 = (value_type)sVar7;
        pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffffdd0,
                           (value_type_conflict2 *)in_stack_fffffffffffffdc8);
        vVar1 = local_44;
        local_98 = (_Base_ptr)pVar8.first._M_node;
        local_90 = pVar8.second;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_84);
        *pvVar6 = vVar1;
      }
      local_9c = AtomType::getIdent(local_80);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_9c);
      if (*pvVar6 == -1) {
        sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2fd862);
        local_48 = (value_type)sVar7;
        pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffffdd0,
                           (value_type_conflict2 *)in_stack_fffffffffffffdc8);
        local_b0 = (_Base_ptr)pVar8.first._M_node;
        local_a8 = pVar8.second;
        in_stack_fffffffffffffdf4 = local_48;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_9c);
        *pvVar6 = in_stack_fffffffffffffdf4;
      }
      in_stack_fffffffffffffde8 = local_40;
      if (local_40 == (AtomType *)0x0) {
        local_b8 = (RepulsivePowerInteractionType *)0x0;
      }
      else {
        local_b8 = (RepulsivePowerInteractionType *)
                   __dynamic_cast(local_40,&NonBondedInteractionType::typeinfo,
                                  &RepulsivePowerInteractionType::typeinfo,0);
      }
      if (local_b8 == (RepulsivePowerInteractionType *)0x0) {
        AtomType::getName_abi_cxx11_(in_stack_fffffffffffffda8);
        uVar3 = std::__cxx11::string::c_str();
        AtomType::getName_abi_cxx11_(in_stack_fffffffffffffda8);
        in_stack_fffffffffffffdc8 = local_f8;
        uVar4 = std::__cxx11::string::c_str();
        in_stack_fffffffffffffdd0 = &painCave;
        snprintf(painCave.errMsg,2000,
                 "RepulsivePower::initialize could not convert NonBondedInteractionType\n\tto RepulsivePowerInteractionType for %s - %s interaction.\n"
                 ,uVar3,uVar4);
        std::__cxx11::string::~string(in_stack_fffffffffffffdc8);
        std::__cxx11::string::~string(local_d8);
        *(undefined4 *)((long)in_stack_fffffffffffffdd0->errMsg + 0x7d4) = 1;
        *(undefined4 *)((long)in_stack_fffffffffffffdd0->errMsg + 2000) = 1;
        simError();
      }
      in_stack_fffffffffffffdc0 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)RepulsivePowerInteractionType::getSigma(local_b8);
      in_stack_fffffffffffffdb8 =
           (TypeContainer<OpenMD::NonBondedInteractionType,_2> *)
           RepulsivePowerInteractionType::getEpsilon(local_b8);
      in_stack_fffffffffffffdb4 = RepulsivePowerInteractionType::getNrep(local_b8);
      addExplicitInteraction
                ((RepulsivePower *)this_00,atype1,(AtomType *)in_stack_fffffffffffffe60,
                 (RealType)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
    }
    in_stack_fffffffffffffda8 =
         (AtomType *)
         TypeContainer<OpenMD::NonBondedInteractionType,_2>::nextType
                   ((TypeContainer<OpenMD::NonBondedInteractionType,_2> *)in_stack_fffffffffffffdd0,
                    (MapTypeIterator *)in_stack_fffffffffffffdc8);
    local_40 = in_stack_fffffffffffffda8;
  }
  *(undefined1 *)(in_RDI + 8) = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffdc0);
  return;
}

Assistant:

void RepulsivePower::initialize() {
    RPtypes.clear();
    RPtids.clear();
    MixingMap.clear();
    RPtids.resize(forceField_->getNAtomType(), -1);

    ForceField::NonBondedInteractionTypeContainer* nbiTypes =
        forceField_->getNonBondedInteractionTypes();
    ForceField::NonBondedInteractionTypeContainer::MapTypeIterator j;
    ForceField::NonBondedInteractionTypeContainer::KeyType keys;
    NonBondedInteractionType* nbt;
    int rptid1, rptid2;

    for (nbt = nbiTypes->beginType(j); nbt != NULL;
         nbt = nbiTypes->nextType(j)) {
      if (nbt->isRepulsivePower()) {
        keys          = nbiTypes->getKeys(j);
        AtomType* at1 = forceField_->getAtomType(keys[0]);
        if (at1 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "RepulsivePower::initialize could not find AtomType %s\n"
                   "\tto for for %s - %s interaction.\n",
                   keys[0].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        AtomType* at2 = forceField_->getAtomType(keys[1]);
        if (at2 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "RepulsivePower::initialize could not find AtomType %s\n"
                   "\tfor %s - %s nonbonded interaction.\n",
                   keys[1].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        int atid1 = at1->getIdent();
        if (RPtids[atid1] == -1) {
          rptid1 = RPtypes.size();
          RPtypes.insert(atid1);
          RPtids[atid1] = rptid1;
        }
        int atid2 = at2->getIdent();
        if (RPtids[atid2] == -1) {
          rptid2 = RPtypes.size();
          RPtypes.insert(atid2);
          RPtids[atid2] = rptid2;
        }

        RepulsivePowerInteractionType* rpit =
            dynamic_cast<RepulsivePowerInteractionType*>(nbt);
        if (rpit == NULL) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "RepulsivePower::initialize could not convert "
              "NonBondedInteractionType\n"
              "\tto RepulsivePowerInteractionType for %s - %s interaction.\n",
              at1->getName().c_str(), at2->getName().c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        RealType sigma   = rpit->getSigma();
        RealType epsilon = rpit->getEpsilon();
        int nRep         = rpit->getNrep();

        addExplicitInteraction(at1, at2, sigma, epsilon, nRep);
      }
    }
    initialized_ = true;
  }